

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

AspifTextOutput * __thiscall Potassco::AspifTextOutput::push(AspifTextOutput *this,AtomSpan *atoms)

{
  iterator __position;
  undefined4 in_EAX;
  size_t sVar1;
  pointer puVar2;
  Data *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar3;
  
  this_00 = this->data_;
  sVar1 = atoms->size;
  uVar3 = CONCAT44((uint)sVar1,in_EAX);
  __position._M_current =
       (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this_00->directives,__position,(uint *)&stack0xffffffffffffffec);
    this_00 = this->data_;
    puVar2 = (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    sVar1 = atoms->size;
  }
  else {
    *__position._M_current = (uint)sVar1;
    puVar2 = __position._M_current + 1;
    (this_00->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,puVar2,atoms->first,
             atoms->first + sVar1,in_R8,in_R9,uVar3);
  return this;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const AtomSpan& atoms) {
	data_->directives.push_back(static_cast<uint32_t>(size(atoms)));
	data_->directives.insert(data_->directives.end(), begin(atoms), end(atoms));
	return *this;
}